

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralAction::~IfcStructuralAction(IfcStructuralAction *this)

{
  ~IfcStructuralAction
            ((IfcStructuralAction *)
             &this[-1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x58);
  return;
}

Assistant:

IfcStructuralAction() : Object("IfcStructuralAction") {}